

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void cpacr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (uint)env->features;
  if ((uVar1 >> 0x1b & 1) == 0) {
    if ((env[1].xregs[0xd] & 0xf) == 0) {
      uVar1 = 0;
    }
    else {
      uVar2 = (ulong)((uVar1 & 0x100) << 0x17) ^ 0x80000000 | value;
      value = uVar2 | 0x40000000;
      if ((env[1].xregs[0xd] & 0xe) != 0) {
        value = uVar2;
      }
      uVar1 = 0xc0f00000;
    }
    value = (uint64_t)((uint)value & uVar1);
  }
  if ((env->features & 0x210000000) == 0x200000000) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) == 0x16) goto LAB_00619858;
    }
    else if ((~env->pstate & 0xc) == 0) goto LAB_00619858;
    if ((((env->cp15).scr_el3 & 1) != 0) && (((env->cp15).nsacr & 0x400) == 0)) {
      value = value & 0xffffffffff0fffff | (ulong)((uint)(env->cp15).cpacr_el1 & 0xf00000);
    }
  }
LAB_00619858:
  (env->cp15).cpacr_el1 = value;
  return;
}

Assistant:

static void cpacr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    uint32_t mask = 0;

    /* In ARMv8 most bits of CPACR_EL1 are RES0. */
    if (!arm_feature(env, ARM_FEATURE_V8)) {
        /* ARMv7 defines bits for unimplemented coprocessors as RAZ/WI.
         * ASEDIS [31] and D32DIS [30] are both UNK/SBZP without VFP.
         * TRCDIS [28] is RAZ/WI since we do not implement a trace macrocell.
         */
        if (cpu_isar_feature(aa32_vfp_simd, env_archcpu(env))) {
            /* VFP coprocessor: cp10 & cp11 [23:20] */
            mask |= (1UL << 31) | (1 << 30) | (0xf << 20);

            if (!arm_feature(env, ARM_FEATURE_NEON)) {
                /* ASEDIS [31] bit is RAO/WI */
                value |= (1UL << 31);
            }

            /* VFPv3 and upwards with NEON implement 32 double precision
             * registers (D0-D31).
             */
            if (!cpu_isar_feature(aa32_simd_r32, env_archcpu(env))) {
                /* D32DIS [30] is RAO/WI if D16-31 are not implemented. */
                value |= (1 << 30);
            }
        }
        value &= mask;
    }

    /*
     * For A-profile AArch32 EL3 (but not M-profile secure mode), if NSACR.CP10
     * is 0 then CPACR.{CP11,CP10} ignore writes and read as 0b00.
     */
    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value &= ~(0xf << 20);
        value |= env->cp15.cpacr_el1 & (0xf << 20);
    }

    env->cp15.cpacr_el1 = value;
}